

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right.cpp
# Opt level: O1

void duckdb::RightFunction<duckdb::LeftRightGrapheme>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  VectorType VVar2;
  VectorType VVar3;
  unsigned_long *puVar4;
  anon_union_16_2_67f50693_for_value *paVar5;
  idx_t count;
  size_t *psVar6;
  Vector *pVVar7;
  data_ptr_t pdVar8;
  data_ptr_t pdVar9;
  sel_t *psVar10;
  sel_t *psVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  byte bVar13;
  undefined1 auVar14 [8];
  reference vector;
  reference vector_00;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  idx_t iVar19;
  ulong uVar20;
  TemplatedValidityData<unsigned_long> *pTVar21;
  size_t sVar22;
  idx_t iVar23;
  unsigned_long uVar24;
  ulong uVar25;
  ulong uVar26;
  idx_t iVar27;
  long lVar28;
  size_t sVar29;
  data_ptr_t pdVar30;
  data_ptr_t pdVar31;
  data_ptr_t pdVar32;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var33;
  size_t sVar34;
  int64_t in_R9;
  idx_t idx_in_entry;
  string_t sVar35;
  anon_struct_16_3_d7536bce_for_pointer aVar36;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  string_t input_04;
  string_t input_05;
  string_t input_06;
  string_t input_07;
  string_t input_08;
  string_t input_09;
  UnifiedVectorFormat ldata;
  undefined1 local_e8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  ValidityMask *local_d8;
  UnifiedVectorFormat local_d0;
  ulong local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar2 = vector->vector_type;
  VVar3 = vector_00->vector_type;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    paVar5 = (anon_union_16_2_67f50693_for_value *)result->data;
    if (((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) ||
       ((puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar4 != (unsigned_long *)0x0 && ((*puVar4 & 1) == 0)))) {
LAB_01051825:
      ConstantVector::SetNull(result,true);
      return;
    }
    pVVar7 = *(Vector **)vector->data;
    pdVar8 = *(data_ptr_t *)(vector->data + 8);
    pdVar30 = pdVar8;
    if (((ulong)pVVar7 & 0xffffffff) < 0xd) {
      pdVar30 = (data_ptr_t)((long)&local_d0.sel + 4);
    }
    sVar29 = *(size_t *)vector_00->data;
    local_d0.sel = (SelectionVector *)pVVar7;
    local_d0.data = pdVar8;
    sVar22 = (ulong)pVVar7 & 0xffffffff;
    if (sVar22 != 0) {
      uVar15 = 0;
      do {
        if ((char)pdVar30[uVar15] < '\0') {
          sVar22 = Utf8Proc::GraphemeCount((char *)pdVar30,sVar22);
          break;
        }
        uVar15 = uVar15 + 1;
      } while (sVar22 != uVar15);
    }
    if ((long)sVar29 < 0) {
      sVar17 = -sVar29;
      if (SBORROW8(sVar22,-sVar29) != (long)(sVar22 + sVar29) < 0) {
        sVar17 = sVar22;
      }
      sVar29 = sVar22 - sVar17;
    }
    else if ((long)sVar22 < (long)sVar29) {
      sVar29 = sVar22;
    }
    input_07.value._8_8_ = (sVar22 - sVar29) + 1;
    input_07.value._0_8_ = pdVar8;
    aVar36 = (anon_struct_16_3_d7536bce_for_pointer)
             SubstringGrapheme((duckdb *)result,pVVar7,input_07,sVar29,in_R9);
    paVar5->pointer = aVar36;
  }
  else {
    count = args->count;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      pdVar8 = vector->data;
      psVar6 = (size_t *)vector_00->data;
      puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
        goto LAB_01051825;
      }
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar30 = result->data;
      FlatVector::VerifyFlatVector(result);
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          sVar29 = *psVar6;
          iVar27 = 0;
          do {
            lVar28 = iVar27 * 0x10;
            pVVar7 = *(Vector **)(pdVar8 + lVar28);
            pdVar9 = *(data_ptr_t *)(pdVar8 + lVar28 + 8);
            pdVar31 = pdVar9;
            if (((ulong)pVVar7 & 0xffffffff) < 0xd) {
              pdVar31 = (data_ptr_t)((long)&local_d0.sel + 4);
            }
            local_d0.sel = (SelectionVector *)pVVar7;
            local_d0.data = pdVar9;
            sVar22 = (ulong)pVVar7 & 0xffffffff;
            if (sVar22 != 0) {
              uVar15 = 0;
              do {
                if ((char)pdVar31[uVar15] < '\0') {
                  sVar22 = Utf8Proc::GraphemeCount((char *)pdVar31,sVar22);
                  break;
                }
                uVar15 = uVar15 + 1;
              } while (sVar22 != uVar15);
            }
            if ((long)sVar29 < 0) {
              sVar17 = -sVar29;
              if ((long)sVar22 < (long)-sVar29) {
                sVar17 = sVar22;
              }
              sVar34 = 0;
              if (sVar29 != 0x8000000000000000) {
                sVar34 = sVar22 - sVar17;
              }
            }
            else {
              sVar34 = sVar29;
              if ((long)sVar22 < (long)sVar29) {
                sVar34 = sVar22;
              }
            }
            input_04.value._8_8_ = (sVar22 - sVar34) + 1;
            input_04.value._0_8_ = pdVar9;
            sVar35 = SubstringGrapheme((duckdb *)result,pVVar7,input_04,sVar34,in_R9);
            *(long *)(pdVar30 + lVar28) = sVar35.value._0_8_;
            *(long *)(pdVar30 + lVar28 + 8) = sVar35.value._8_8_;
            iVar27 = iVar27 + 1;
          } while (iVar27 != count);
        }
      }
      else if (0x3f < count + 0x3f) {
        local_d8 = (ValidityMask *)(count + 0x3f >> 6);
        uVar25 = 0;
        uVar15 = 0;
        do {
          puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar16 = 0xffffffffffffffff;
          }
          else {
            uVar16 = puVar4[uVar15];
          }
          uVar20 = uVar25 + 0x40;
          if (count <= uVar25 + 0x40) {
            uVar20 = count;
          }
          uVar26 = uVar20;
          if (uVar16 != 0) {
            uVar26 = uVar25;
            if (uVar16 == 0xffffffffffffffff) {
              if (uVar25 < uVar20) {
                sVar29 = *psVar6;
                do {
                  lVar28 = uVar25 * 0x10;
                  pVVar7 = *(Vector **)(pdVar8 + lVar28);
                  pdVar9 = *(data_ptr_t *)(pdVar8 + lVar28 + 8);
                  pdVar31 = pdVar9;
                  if (((ulong)pVVar7 & 0xffffffff) < 0xd) {
                    pdVar31 = (data_ptr_t)((long)&local_d0.sel + 4);
                  }
                  local_d0.sel = (SelectionVector *)pVVar7;
                  local_d0.data = pdVar9;
                  sVar22 = (ulong)pVVar7 & 0xffffffff;
                  if (sVar22 != 0) {
                    uVar16 = 0;
                    do {
                      if ((char)pdVar31[uVar16] < '\0') {
                        sVar22 = Utf8Proc::GraphemeCount((char *)pdVar31,sVar22);
                        break;
                      }
                      uVar16 = uVar16 + 1;
                    } while (sVar22 != uVar16);
                  }
                  if ((long)sVar29 < 0) {
                    sVar17 = -sVar29;
                    if ((long)sVar22 < (long)-sVar29) {
                      sVar17 = sVar22;
                    }
                    sVar34 = 0;
                    if (sVar29 != 0x8000000000000000) {
                      sVar34 = sVar22 - sVar17;
                    }
                  }
                  else {
                    sVar34 = sVar29;
                    if ((long)sVar22 < (long)sVar29) {
                      sVar34 = sVar22;
                    }
                  }
                  input.value._8_8_ = (sVar22 - sVar34) + 1;
                  input.value._0_8_ = pdVar9;
                  sVar35 = SubstringGrapheme((duckdb *)result,pVVar7,input,sVar34,in_R9);
                  *(long *)(pdVar30 + lVar28) = sVar35.value._0_8_;
                  *(long *)(pdVar30 + lVar28 + 8) = sVar35.value._8_8_;
                  uVar25 = uVar25 + 1;
                  uVar26 = uVar25;
                } while (uVar25 != uVar20);
              }
            }
            else if (uVar25 < uVar20) {
              do {
                if ((uVar16 >> ((ulong)(uint)((int)uVar26 - (int)uVar25) & 0x3f) & 1) != 0) {
                  lVar28 = uVar26 * 0x10;
                  pVVar7 = *(Vector **)(pdVar8 + lVar28);
                  pdVar9 = *(data_ptr_t *)(pdVar8 + lVar28 + 8);
                  pdVar31 = pdVar9;
                  if (((ulong)pVVar7 & 0xffffffff) < 0xd) {
                    pdVar31 = (data_ptr_t)((long)&local_d0.sel + 4);
                  }
                  sVar29 = *psVar6;
                  local_d0.sel = (SelectionVector *)pVVar7;
                  local_d0.data = pdVar9;
                  sVar22 = (ulong)pVVar7 & 0xffffffff;
                  if (sVar22 != 0) {
                    uVar18 = 0;
                    do {
                      if ((char)pdVar31[uVar18] < '\0') {
                        sVar22 = Utf8Proc::GraphemeCount((char *)pdVar31,sVar22);
                        break;
                      }
                      uVar18 = uVar18 + 1;
                    } while (sVar22 != uVar18);
                  }
                  if ((long)sVar29 < 0) {
                    if (sVar29 == 0x8000000000000000) {
                      sVar29 = 0;
                    }
                    else {
                      sVar17 = -sVar29;
                      if (SBORROW8(sVar22,-sVar29) != (long)(sVar22 + sVar29) < 0) {
                        sVar17 = sVar22;
                      }
                      sVar29 = sVar22 - sVar17;
                    }
                  }
                  else if ((long)sVar22 < (long)sVar29) {
                    sVar29 = sVar22;
                  }
                  input_00.value._8_8_ = (sVar22 - sVar29) + 1;
                  input_00.value._0_8_ = pdVar9;
                  sVar35 = SubstringGrapheme((duckdb *)result,pVVar7,input_00,sVar29,in_R9);
                  *(long *)(pdVar30 + lVar28) = sVar35.value._0_8_;
                  *(long *)(pdVar30 + lVar28 + 8) = sVar35.value._8_8_;
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar20);
            }
          }
          uVar25 = uVar26;
          uVar15 = uVar15 + 1;
        } while ((ValidityMask *)uVar15 != local_d8);
      }
    }
    else if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar3 == FLAT_VECTOR) {
      pdVar8 = vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar30 = vector_00->data;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
        goto LAB_01051825;
      }
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar9 = result->data;
      FlatVector::VerifyFlatVector(result);
      FlatVector::VerifyFlatVector(vector_00);
      FlatVector::VerifyFlatVector(result);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          pVVar7 = *(Vector **)pdVar8;
          pdVar8 = *(data_ptr_t *)(pdVar8 + 8);
          iVar27 = 0;
          do {
            pdVar31 = pdVar8;
            if (((ulong)pVVar7 & 0xffffffff) < 0xd) {
              pdVar31 = (data_ptr_t)((long)&local_d0.sel + 4);
            }
            sVar29 = *(size_t *)(pdVar30 + iVar27 * 8);
            local_d0.sel = (SelectionVector *)pVVar7;
            local_d0.data = pdVar8;
            sVar22 = (ulong)pVVar7 & 0xffffffff;
            if (sVar22 != 0) {
              uVar15 = 0;
              do {
                if ((char)pdVar31[uVar15] < '\0') {
                  sVar22 = Utf8Proc::GraphemeCount((char *)pdVar31,sVar22);
                  break;
                }
                uVar15 = uVar15 + 1;
              } while (sVar22 != uVar15);
            }
            if ((long)sVar29 < 0) {
              if (sVar29 == 0x8000000000000000) {
                sVar29 = 0;
              }
              else {
                sVar17 = -sVar29;
                if (SBORROW8(sVar22,-sVar29) != (long)(sVar22 + sVar29) < 0) {
                  sVar17 = sVar22;
                }
                sVar29 = sVar22 - sVar17;
              }
            }
            else if ((long)sVar22 < (long)sVar29) {
              sVar29 = sVar22;
            }
            input_09.value._8_8_ = (sVar22 - sVar29) + 1;
            input_09.value._0_8_ = pdVar8;
            sVar35 = SubstringGrapheme((duckdb *)result,pVVar7,input_09,sVar29,in_R9);
            *(long *)(pdVar9 + iVar27 * 0x10) = sVar35.value._0_8_;
            *(long *)(pdVar9 + iVar27 * 0x10 + 8) = sVar35.value._8_8_;
            iVar27 = iVar27 + 1;
          } while (iVar27 != count);
        }
      }
      else if (0x3f < count + 0x3f) {
        uVar25 = 0;
        uVar15 = 0;
        do {
          puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar16 = 0xffffffffffffffff;
          }
          else {
            uVar16 = puVar4[uVar15];
          }
          uVar20 = uVar25 + 0x40;
          if (count <= uVar25 + 0x40) {
            uVar20 = count;
          }
          uVar26 = uVar20;
          if (uVar16 != 0) {
            uVar26 = uVar25;
            if (uVar16 == 0xffffffffffffffff) {
              if (uVar25 < uVar20) {
                pVVar7 = *(Vector **)pdVar8;
                pdVar31 = *(data_ptr_t *)(pdVar8 + 8);
                do {
                  pdVar32 = pdVar31;
                  if (((ulong)pVVar7 & 0xffffffff) < 0xd) {
                    pdVar32 = (data_ptr_t)((long)&local_d0.sel + 4);
                  }
                  sVar29 = *(size_t *)(pdVar30 + uVar25 * 8);
                  local_d0.sel = (SelectionVector *)pVVar7;
                  local_d0.data = pdVar31;
                  sVar22 = (ulong)pVVar7 & 0xffffffff;
                  if (sVar22 != 0) {
                    uVar16 = 0;
                    do {
                      if ((char)pdVar32[uVar16] < '\0') {
                        sVar22 = Utf8Proc::GraphemeCount((char *)pdVar32,sVar22);
                        break;
                      }
                      uVar16 = uVar16 + 1;
                    } while (sVar22 != uVar16);
                  }
                  if ((long)sVar29 < 0) {
                    if (sVar29 == 0x8000000000000000) {
                      sVar29 = 0;
                    }
                    else {
                      sVar17 = -sVar29;
                      if (SBORROW8(sVar22,-sVar29) != (long)(sVar22 + sVar29) < 0) {
                        sVar17 = sVar22;
                      }
                      sVar29 = sVar22 - sVar17;
                    }
                  }
                  else if ((long)sVar22 < (long)sVar29) {
                    sVar29 = sVar22;
                  }
                  input_02.value._8_8_ = (sVar22 - sVar29) + 1;
                  input_02.value._0_8_ = pdVar31;
                  sVar35 = SubstringGrapheme((duckdb *)result,pVVar7,input_02,sVar29,in_R9);
                  *(long *)(pdVar9 + uVar25 * 0x10) = sVar35.value._0_8_;
                  *(long *)(pdVar9 + uVar25 * 0x10 + 8) = sVar35.value._8_8_;
                  uVar25 = uVar25 + 1;
                  uVar26 = uVar25;
                } while (uVar25 != uVar20);
              }
            }
            else if (uVar25 < uVar20) {
              do {
                if ((uVar16 >> ((ulong)(uint)((int)uVar26 - (int)uVar25) & 0x3f) & 1) != 0) {
                  pVVar7 = *(Vector **)pdVar8;
                  pdVar31 = *(data_ptr_t *)(pdVar8 + 8);
                  pdVar32 = pdVar31;
                  if (((ulong)pVVar7 & 0xffffffff) < 0xd) {
                    pdVar32 = (data_ptr_t)((long)&local_d0.sel + 4);
                  }
                  sVar29 = *(size_t *)(pdVar30 + uVar26 * 8);
                  local_d0.sel = (SelectionVector *)pVVar7;
                  local_d0.data = pdVar31;
                  sVar22 = (ulong)pVVar7 & 0xffffffff;
                  if (sVar22 != 0) {
                    uVar18 = 0;
                    do {
                      if ((char)pdVar32[uVar18] < '\0') {
                        sVar22 = Utf8Proc::GraphemeCount((char *)pdVar32,sVar22);
                        break;
                      }
                      uVar18 = uVar18 + 1;
                    } while (sVar22 != uVar18);
                  }
                  if ((long)sVar29 < 0) {
                    if (sVar29 == 0x8000000000000000) {
                      sVar29 = 0;
                    }
                    else {
                      sVar17 = -sVar29;
                      if (SBORROW8(sVar22,-sVar29) != (long)(sVar22 + sVar29) < 0) {
                        sVar17 = sVar22;
                      }
                      sVar29 = sVar22 - sVar17;
                    }
                  }
                  else if ((long)sVar22 < (long)sVar29) {
                    sVar29 = sVar22;
                  }
                  input_03.value._8_8_ = (sVar22 - sVar29) + 1;
                  input_03.value._0_8_ = pdVar31;
                  sVar35 = SubstringGrapheme((duckdb *)result,pVVar7,input_03,sVar29,in_R9);
                  *(long *)(pdVar9 + uVar26 * 0x10) = sVar35.value._0_8_;
                  *(long *)(pdVar9 + uVar26 * 0x10 + 8) = sVar35.value._8_8_;
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar20);
            }
          }
          uVar25 = uVar26;
          uVar15 = uVar15 + 1;
        } while (uVar15 != count + 0x3f >> 6);
      }
    }
    else if (VVar3 == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      pdVar8 = vector->data;
      pdVar30 = vector_00->data;
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar9 = result->data;
      FlatVector::VerifyFlatVector(result);
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      FlatVector::VerifyFlatVector(vector_00);
      local_d8 = &result->validity;
      ValidityMask::Combine(&result->validity,&vector_00->validity,count);
      if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          iVar27 = 0;
          do {
            lVar28 = iVar27 * 0x10;
            pVVar7 = *(Vector **)(pdVar8 + lVar28);
            pdVar31 = *(data_ptr_t *)(pdVar8 + lVar28 + 8);
            pdVar32 = pdVar31;
            if (((ulong)pVVar7 & 0xffffffff) < 0xd) {
              pdVar32 = (data_ptr_t)((long)&local_d0.sel + 4);
            }
            sVar29 = *(size_t *)(pdVar30 + iVar27 * 8);
            local_d0.sel = (SelectionVector *)pVVar7;
            local_d0.data = pdVar31;
            sVar22 = (ulong)pVVar7 & 0xffffffff;
            if (sVar22 != 0) {
              uVar15 = 0;
              do {
                if ((char)pdVar32[uVar15] < '\0') {
                  sVar22 = Utf8Proc::GraphemeCount((char *)pdVar32,sVar22);
                  break;
                }
                uVar15 = uVar15 + 1;
              } while (sVar22 != uVar15);
            }
            if ((long)sVar29 < 0) {
              if (sVar29 == 0x8000000000000000) {
                sVar29 = 0;
              }
              else {
                sVar17 = -sVar29;
                if (SBORROW8(sVar22,-sVar29) != (long)(sVar22 + sVar29) < 0) {
                  sVar17 = sVar22;
                }
                sVar29 = sVar22 - sVar17;
              }
            }
            else if ((long)sVar22 < (long)sVar29) {
              sVar29 = sVar22;
            }
            sVar35.value._8_8_ = (sVar22 - sVar29) + 1;
            sVar35.value._0_8_ = pdVar31;
            sVar35 = SubstringGrapheme((duckdb *)result,pVVar7,sVar35,sVar29,in_R9);
            *(long *)(pdVar9 + lVar28) = sVar35.value._0_8_;
            *(long *)(pdVar9 + lVar28 + 8) = sVar35.value._8_8_;
            iVar27 = iVar27 + 1;
          } while (iVar27 != count);
        }
      }
      else if (0x3f < count + 0x3f) {
        local_88 = count + 0x3f >> 6;
        uVar25 = 0;
        uVar15 = 0;
        do {
          puVar4 = (local_d8->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar24 = 0xffffffffffffffff;
          }
          else {
            uVar24 = puVar4[uVar25];
          }
          uVar16 = uVar15 + 0x40;
          if (count <= uVar15 + 0x40) {
            uVar16 = count;
          }
          uVar20 = uVar16;
          if (uVar24 != 0) {
            uVar20 = uVar15;
            if (uVar24 == 0xffffffffffffffff) {
              if (uVar15 < uVar16) {
                do {
                  lVar28 = uVar15 * 0x10;
                  pVVar7 = *(Vector **)(pdVar8 + lVar28);
                  pdVar31 = *(data_ptr_t *)(pdVar8 + lVar28 + 8);
                  pdVar32 = pdVar31;
                  if (((ulong)pVVar7 & 0xffffffff) < 0xd) {
                    pdVar32 = (data_ptr_t)((long)&local_d0.sel + 4);
                  }
                  sVar29 = *(size_t *)(pdVar30 + uVar15 * 8);
                  local_d0.sel = (SelectionVector *)pVVar7;
                  local_d0.data = pdVar31;
                  sVar22 = (ulong)pVVar7 & 0xffffffff;
                  if (sVar22 != 0) {
                    uVar20 = 0;
                    do {
                      if ((char)pdVar32[uVar20] < '\0') {
                        sVar22 = Utf8Proc::GraphemeCount((char *)pdVar32,sVar22);
                        break;
                      }
                      uVar20 = uVar20 + 1;
                    } while (sVar22 != uVar20);
                  }
                  if ((long)sVar29 < 0) {
                    if (sVar29 == 0x8000000000000000) {
                      sVar29 = 0;
                    }
                    else {
                      sVar17 = -sVar29;
                      if (SBORROW8(sVar22,-sVar29) != (long)(sVar22 + sVar29) < 0) {
                        sVar17 = sVar22;
                      }
                      sVar29 = sVar22 - sVar17;
                    }
                  }
                  else if ((long)sVar22 < (long)sVar29) {
                    sVar29 = sVar22;
                  }
                  input_05.value._8_8_ = (sVar22 - sVar29) + 1;
                  input_05.value._0_8_ = pdVar31;
                  sVar35 = SubstringGrapheme((duckdb *)result,pVVar7,input_05,sVar29,in_R9);
                  *(long *)(pdVar9 + lVar28) = sVar35.value._0_8_;
                  *(long *)(pdVar9 + lVar28 + 8) = sVar35.value._8_8_;
                  uVar15 = uVar15 + 1;
                  uVar20 = uVar15;
                } while (uVar15 != uVar16);
              }
            }
            else if (uVar15 < uVar16) {
              do {
                if ((uVar24 >> ((ulong)(uint)((int)uVar20 - (int)uVar15) & 0x3f) & 1) != 0) {
                  lVar28 = uVar20 * 0x10;
                  pVVar7 = *(Vector **)(pdVar8 + lVar28);
                  pdVar31 = *(data_ptr_t *)(pdVar8 + lVar28 + 8);
                  pdVar32 = pdVar31;
                  if (((ulong)pVVar7 & 0xffffffff) < 0xd) {
                    pdVar32 = (data_ptr_t)((long)&local_d0.sel + 4);
                  }
                  sVar29 = *(size_t *)(pdVar30 + uVar20 * 8);
                  local_d0.sel = (SelectionVector *)pVVar7;
                  local_d0.data = pdVar31;
                  sVar22 = (ulong)pVVar7 & 0xffffffff;
                  if (sVar22 != 0) {
                    uVar26 = 0;
                    do {
                      if ((char)pdVar32[uVar26] < '\0') {
                        sVar22 = Utf8Proc::GraphemeCount((char *)pdVar32,sVar22);
                        break;
                      }
                      uVar26 = uVar26 + 1;
                    } while (sVar22 != uVar26);
                  }
                  if ((long)sVar29 < 0) {
                    if (sVar29 == 0x8000000000000000) {
                      sVar29 = 0;
                    }
                    else {
                      sVar17 = -sVar29;
                      if (SBORROW8(sVar22,-sVar29) != (long)(sVar22 + sVar29) < 0) {
                        sVar17 = sVar22;
                      }
                      sVar29 = sVar22 - sVar17;
                    }
                  }
                  else if ((long)sVar22 < (long)sVar29) {
                    sVar29 = sVar22;
                  }
                  input_06.value._8_8_ = (sVar22 - sVar29) + 1;
                  input_06.value._0_8_ = pdVar31;
                  sVar35 = SubstringGrapheme((duckdb *)result,pVVar7,input_06,sVar29,in_R9);
                  *(long *)(pdVar9 + lVar28) = sVar35.value._0_8_;
                  *(long *)(pdVar9 + lVar28 + 8) = sVar35.value._8_8_;
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar16);
            }
          }
          uVar25 = uVar25 + 1;
          uVar15 = uVar20;
        } while (uVar25 != local_88);
      }
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_d0);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
      Vector::ToUnifiedFormat(vector,count,&local_d0);
      Vector::ToUnifiedFormat(vector_00,count,&local_78);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar8 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0 &&
          local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          psVar10 = (local_d0.sel)->sel_vector;
          psVar11 = (local_78.sel)->sel_vector;
          iVar27 = 0;
          do {
            iVar19 = iVar27;
            if (psVar10 != (sel_t *)0x0) {
              iVar19 = (idx_t)psVar10[iVar27];
            }
            iVar23 = iVar27;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar27];
            }
            pVVar7 = *(Vector **)(local_d0.data + iVar19 * 0x10);
            p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       (local_d0.data + iVar19 * 0x10 + 8);
            p_Var33 = p_Var12;
            if (((ulong)pVVar7 & 0xffffffff) < 0xd) {
              p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 4);
            }
            sVar29 = *(size_t *)(local_78.data + iVar23 * 8);
            p_Stack_e0 = p_Var12;
            sVar22 = (ulong)pVVar7 & 0xffffffff;
            local_e8 = (undefined1  [8])pVVar7;
            if (sVar22 != 0) {
              uVar15 = 0;
              do {
                if (*(char *)((long)&p_Var33->_vptr__Sp_counted_base + uVar15) < '\0') {
                  sVar22 = Utf8Proc::GraphemeCount((char *)p_Var33,sVar22);
                  break;
                }
                uVar15 = uVar15 + 1;
              } while (sVar22 != uVar15);
            }
            if ((long)sVar29 < 0) {
              if (sVar29 == 0x8000000000000000) {
                sVar29 = 0;
              }
              else {
                sVar17 = -sVar29;
                if (SBORROW8(sVar22,-sVar29) != (long)(sVar22 + sVar29) < 0) {
                  sVar17 = sVar22;
                }
                sVar29 = sVar22 - sVar17;
              }
            }
            else if ((long)sVar22 < (long)sVar29) {
              sVar29 = sVar22;
            }
            input_01.value._8_8_ = (sVar22 - sVar29) + 1;
            input_01.value._0_8_ = p_Var12;
            sVar35 = SubstringGrapheme((duckdb *)result,pVVar7,input_01,sVar29,in_R9);
            *(long *)(pdVar8 + iVar27 * 0x10) = sVar35.value._0_8_;
            *(long *)(pdVar8 + iVar27 * 0x10 + 8) = sVar35.value._8_8_;
            iVar27 = iVar27 + 1;
          } while (iVar27 != count);
        }
      }
      else if (count != 0) {
        psVar10 = (local_d0.sel)->sel_vector;
        psVar11 = (local_78.sel)->sel_vector;
        uVar15 = 0;
        do {
          uVar25 = uVar15;
          if (psVar10 != (sel_t *)0x0) {
            uVar25 = (ulong)psVar10[uVar15];
          }
          uVar16 = uVar15;
          if (psVar11 != (sel_t *)0x0) {
            uVar16 = (ulong)psVar11[uVar15];
          }
          if (((local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) ||
              ((local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                [uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) &&
             ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0 ||
              ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0)))) {
            pVVar7 = *(Vector **)(local_d0.data + uVar25 * 0x10);
            p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       (local_d0.data + uVar25 * 0x10 + 8);
            p_Var33 = p_Var12;
            if (((ulong)pVVar7 & 0xffffffff) < 0xd) {
              p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 4);
            }
            sVar29 = *(size_t *)(local_78.data + uVar16 * 8);
            p_Stack_e0 = p_Var12;
            sVar22 = (ulong)pVVar7 & 0xffffffff;
            local_e8 = (undefined1  [8])pVVar7;
            if (sVar22 != 0) {
              uVar25 = 0;
              do {
                if (*(char *)((long)&p_Var33->_vptr__Sp_counted_base + uVar25) < '\0') {
                  sVar22 = Utf8Proc::GraphemeCount((char *)p_Var33,sVar22);
                  break;
                }
                uVar25 = uVar25 + 1;
              } while (sVar22 != uVar25);
            }
            if ((long)sVar29 < 0) {
              if (sVar29 == 0x8000000000000000) {
                sVar29 = 0;
              }
              else {
                sVar17 = -sVar29;
                if (SBORROW8(sVar22,-sVar29) != (long)(sVar22 + sVar29) < 0) {
                  sVar17 = sVar22;
                }
                sVar29 = sVar22 - sVar17;
              }
            }
            else if ((long)sVar22 < (long)sVar29) {
              sVar29 = sVar22;
            }
            input_08.value._8_8_ = (sVar22 - sVar29) + 1;
            input_08.value._0_8_ = p_Var12;
            sVar35 = SubstringGrapheme((duckdb *)result,pVVar7,input_08,sVar29,in_R9);
            *(long *)(pdVar8 + uVar15 * 0x10) = sVar35.value._0_8_;
            *(long *)(pdVar8 + uVar15 * 0x10 + 8) = sVar35.value._8_8_;
          }
          else {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_e8,&local_80);
              p_Var33 = p_Stack_e0;
              auVar14 = local_e8;
              local_e8 = (undefined1  [8])0x0;
              p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var12 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)auVar14;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var33;
              if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
              }
              if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
              }
              pTVar21 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar21->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar13 = (byte)uVar15 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar15 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != count);
      }
      if (local_78.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_d0.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d0.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
  }
  return;
}

Assistant:

static void RightFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &str_vec = args.data[0];
	auto &pos_vec = args.data[1];
	BinaryExecutor::Execute<string_t, int64_t, string_t>(
	    str_vec, pos_vec, result, args.size(),
	    [&](string_t str, int64_t pos) { return RightScalarFunction<OP>(result, str, pos); });
}